

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O1

int compareStringsInUtf8(QUtf8StringView lhs,QStringView rhs,Comparison mode)

{
  storage_type_conflict *psVar1;
  storage_type_conflict sVar2;
  storage_type_conflict sVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  storage_type_conflict *psVar7;
  storage_type_conflict *psVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  byte *pbVar13;
  size_t __n;
  long in_FS_OFFSET;
  bool bVar14;
  bool bVar15;
  undefined4 local_3c;
  long local_38;
  
  lVar10 = lhs.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar1 = rhs.m_data + rhs.m_size;
  lVar12 = 0;
  lVar9 = 0;
  psVar7 = rhs.m_data;
  do {
    psVar8 = psVar7 + 1;
    local_3c = 0xaaaaaaaa;
    sVar2 = *psVar7;
    uVar6 = (ulong)(ushort)sVar2;
    if ((ushort)sVar2 < 0x80) {
      local_3c = CONCAT31(0xaaaaaa,(char)sVar2);
      pbVar13 = (byte *)((long)&local_3c + 1);
      goto LAB_002ec99f;
    }
    if ((ushort)sVar2 < 0x800) {
      local_3c = CONCAT31(0xaaaaaa,(char)((ushort)sVar2 >> 6)) | 0xc0;
      pbVar13 = (byte *)((long)&local_3c + 1);
LAB_002ec991:
      *pbVar13 = (byte)uVar6 & 0x3f | 0x80;
      pbVar13 = pbVar13 + 1;
    }
    else {
      if ((sVar2 & 0xf800U) != 0xd800) {
        local_3c = CONCAT31(0xaaaaaa,(byte)((ushort)sVar2 >> 0xc)) | 0xe0;
        pbVar13 = (byte *)((long)&local_3c + 1);
LAB_002ec97f:
        *pbVar13 = (byte)(uVar6 >> 6) & 0x3f | 0x80;
        pbVar13 = pbVar13 + 1;
        goto LAB_002ec991;
      }
      pbVar13 = (byte *)&local_3c;
      if (psVar8 != psVar1) {
        if (((sVar2 & 0xdc00U) == 0xd800) && (sVar3 = *psVar8, ((ushort)sVar3 & 0xfc00) == 0xdc00))
        {
          psVar8 = psVar7 + 2;
          uVar4 = (uint)(ushort)sVar2 * 0x400 + (uint)(ushort)sVar3 + 0xfca02400;
          uVar6 = (ulong)uVar4;
          local_3c = CONCAT22(0xaaaa,CONCAT11((char)(uVar4 >> 0xc),(char)(uVar4 >> 0x12)) | 0xf0) &
                     0xffff3fff | 0x8000;
          bVar14 = true;
          pbVar13 = (byte *)((long)&local_3c + 2);
        }
        else {
          bVar14 = false;
        }
        if (bVar14) goto LAB_002ec97f;
      }
    }
LAB_002ec99f:
    __n = (long)pbVar13 - (long)&local_3c;
    if (lVar10 - lVar9 < (long)__n) {
      iVar5 = -1;
      goto LAB_002ecaa3;
    }
    iVar5 = memcmp(lhs.m_data + lVar9,&local_3c,__n);
    lVar9 = lVar9 + __n;
    lVar12 = lVar12 + __n;
  } while (((iVar5 == 0) && (lVar9 < lVar10)) && (psVar7 = psVar8, psVar8 < psVar1));
  if ((mode != ForEquality) || (iVar5 == 0)) {
    if ((psVar8 != psVar1) == (lVar9 == lVar10)) {
      bVar14 = lVar9 != lVar10;
    }
    else {
      lVar9 = 0;
      while (psVar8 < psVar1) {
        psVar7 = psVar8 + 1;
        sVar2 = *psVar8;
        if ((ushort)sVar2 < 0x800) {
          lVar11 = (ulong)(0x7f < (ushort)sVar2) + 1;
        }
        else {
          bVar14 = (sVar2 & 0xfc00U) != 0xd800;
          bVar15 = psVar7 == psVar1;
          if (!bVar15 && !bVar14) {
            psVar7 = psVar8 + 2;
          }
          lVar11 = 4 - (ulong)(bVar15 || bVar14);
        }
        lVar9 = lVar9 + lVar11;
        psVar8 = psVar7;
      }
      if (lVar9 + lVar12 == lVar10) goto LAB_002ecaa3;
      bVar14 = lVar9 + lVar12 <= lVar10;
    }
    iVar5 = (uint)bVar14 * 2 + -1;
  }
LAB_002ecaa3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

static int compareStringsInUtf8(QUtf8StringView lhs, QStringView rhs, Comparison mode) noexcept
{
    // CBOR requires that the shortest of the two strings be sorted first, so
    // we have to calculate the UTF-8 length of the UTF-16 string while
    // comparing. Unlike the UTF-32 comparison above, we convert the UTF-16
    // string to UTF-8 so we only need to decode one string.

    const qsizetype len1 = lhs.size();
    const auto src1 = reinterpret_cast<const uchar *>(lhs.data());
    const char16_t *src2 = rhs.utf16();
    const char16_t *const end2 = src2 + rhs.size();

    // Compare the two strings until we find a difference.
    int diff = 0;
    qptrdiff idx1 = 0;
    qsizetype len2 = 0;
    do {
        uchar utf8[4];      // longest possible Unicode character in UTF-8
        uchar *ptr = utf8;
        char16_t uc = *src2++;
        int r = QUtf8Functions::toUtf8<QUtf8BaseTraits>(uc, ptr, src2, end2);
        Q_UNUSED(r);    // ignore failure to encode proper UTF-16 surrogates

        qptrdiff n = ptr - utf8;
        len2 += n;
        if (len1 - idx1 < n)
            return -1;      // lhs is definitely shorter
        diff = memcmp(src1 + idx1, utf8, n);
        idx1 += n;
    } while (diff == 0 && idx1 < len1 && src2 < end2);

    if (mode == Comparison::ForEquality && diff)
        return diff;
    if ((idx1 == len1) != (src2 == end2)) {
        // One of the strings ended earlier than the other
        return idx1 == len1 ? -1 : 1;
    }

    // We found a difference and neither string ended, so continue calculating
    // the UTF-8 length of rhs.
    len2 += stringLengthInUtf8(src2, end2);

    if (len1 != len2)
        return len1 < len2 ? -1 : 1;
    return diff;
}